

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O2

int setSocketNonBlocking(int fd)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = fcntl(fd,3,0);
  if (uVar1 == 0xffffffff) {
    iVar2 = -1;
  }
  else {
    iVar2 = fcntl(fd,4,(ulong)(uVar1 | 0x800));
    iVar2 = -(uint)(iVar2 == -1);
  }
  return iVar2;
}

Assistant:

int setSocketNonBlocking(int fd) {
//	std::cout << "开始设置非阻塞" << std::endl;
//	std::cout << "fd = " << fd << std::endl;
  int flag = fcntl(fd, F_GETFL, 0);
//  std::cout << "flag = " << flag << std::endl;
  if (flag == -1) return -1;

  flag |= O_NONBLOCK;
  if (fcntl(fd, F_SETFL, flag) == -1) return -1;

//	std::cout << "成功设置非阻塞" << std::endl;

  return 0;
}